

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_sse2.c
# Opt level: O2

void av1_highbd_apply_temporal_filter_sse2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  short *psVar1;
  short *psVar2;
  undefined4 *puVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  uint8_t *puVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  byte bVar17;
  byte bVar18;
  int idx;
  uint uVar19;
  uint uVar20;
  uint32_t uVar21;
  int32_t iVar22;
  uint32_t (*pauVar25) [32];
  byte bVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  undefined7 in_register_00000011;
  long lVar30;
  uint32_t *puVar31;
  ulong uVar32;
  uint32_t *puVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  uint uVar40;
  uint32_t *puVar41;
  ulong uVar42;
  int subblock_idx;
  int iVar43;
  long lVar44;
  uint32_t *puVar45;
  long lVar46;
  bool bVar47;
  ulong uVar48;
  uint32_t uVar49;
  double dVar50;
  double dVar51;
  uint32_t uVar53;
  undefined1 auVar52 [16];
  double dVar54;
  uint32_t uVar57;
  undefined1 auVar55 [16];
  double dVar58;
  undefined1 auVar56 [16];
  uint32_t uVar59;
  double dVar60;
  undefined1 auVar61 [16];
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  __m128i vsum1;
  __m128i vsum1_00;
  __m128i vsum1_01;
  __m128i vsum1_02;
  __m128i vsum1_03;
  __m128i vsum1_04;
  __m128i vsum2;
  __m128i vsum2_00;
  __m128i vsum2_01;
  __m128i vsum2_02;
  __m128i vsum2_03;
  __m128i vsum2_04;
  __m128i vsum2_05;
  __m128i vsum2_06;
  int local_34c4;
  undefined1 local_3478 [16];
  double local_3450;
  undefined1 local_3428 [16];
  double local_3410;
  uint32_t *local_3400;
  undefined1 local_33b8 [16];
  double d_factor [4];
  double adStack_3318 [4];
  double subblock_mses_scaled [4];
  undefined1 local_3298 [16];
  undefined1 local_3288 [16];
  undefined1 local_3278 [16];
  undefined4 local_3268;
  undefined4 uStack_3264;
  undefined4 uStack_3260;
  undefined4 uStack_325c;
  undefined1 local_3258 [16];
  undefined4 local_3248;
  undefined4 uStack_3244;
  undefined4 uStack_3240;
  undefined4 uStack_323c;
  uint32_t luma_sse_sum [1024];
  uint32_t acc_5x5_sse [32] [32];
  uint32_t frame_sse [1152];
  ulong uVar23;
  ulong uVar24;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  ulong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ulong extraout_RDX_06;
  
  uVar36 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar4 = block_size_high[uVar36];
  bVar5 = block_size_wide[uVar36];
  iVar39 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar43 = (frame_to_filter->field_3).field_0.y_crop_height;
  if (iVar43 < iVar39) {
    iVar39 = iVar43;
  }
  dVar62 = (double)q_factor / 20.0;
  dVar62 = dVar62 * dVar62;
  dVar50 = 1.0;
  if (dVar62 <= 1.0) {
    dVar50 = dVar62;
  }
  dVar60 = (double)q_factor * 0.015625;
  local_3478._0_8_ =
       -(ulong)(dVar62 < 1e-05) & 0x3ee4f8b588e368f1 | ~-(ulong)(dVar62 < 1e-05) & (ulong)dVar50;
  local_3478._8_8_ = 0;
  dVar62 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  dVar50 = 1.0;
  if (dVar62 <= 1.0) {
    dVar50 = dVar62;
  }
  d_factor[2] = 0.0;
  d_factor[3] = 0.0;
  d_factor[0] = 0.0;
  d_factor[1] = 0.0;
  lVar44 = 0;
  memset(frame_sse,0,0x1200);
  memset(luma_sse_sum,0,0x1000);
  dVar51 = (double)iVar39 * 0.1;
  if (dVar51 <= 1.0) {
    dVar51 = 1.0;
  }
  for (; lVar44 != 4; lVar44 = lVar44 + 1) {
    auVar55 = pshuflw(ZEXT416((uint)subblock_mvs[lVar44]),ZEXT416((uint)subblock_mvs[lVar44]),0x60);
    dVar54 = (double)(auVar55._0_4_ >> 0x10);
    dVar58 = (double)(auVar55._4_4_ >> 0x10);
    dVar54 = SQRT(dVar58 * dVar58 + dVar54 * dVar54) / dVar51;
    if (dVar54 <= 1.0) {
      dVar54 = 1.0;
    }
    d_factor[lVar44] = dVar54;
  }
  local_3410 = dVar60 * dVar60 * 0.5;
  if (q_factor < 0x80) {
    local_3410 = (double)local_3478._0_8_;
  }
  if (num_planes < 1) {
    num_planes = 0;
  }
  local_34c4 = 0;
  for (uVar36 = 0; uVar36 != (uint)num_planes; uVar36 = uVar36 + 1) {
    bVar27 = (byte)mbd->plane[uVar36].subsampling_y;
    bVar17 = bVar4 >> (bVar27 & 0x1f);
    uVar19 = (uint)bVar17;
    uVar23 = (ulong)uVar19;
    bVar26 = (byte)mbd->plane[uVar36].subsampling_x;
    bVar18 = bVar5 >> (bVar26 & 0x1f);
    uVar20 = (uint)bVar18;
    uVar24 = (ulong)uVar20;
    bVar26 = bVar26 - (char)mbd->plane[0].subsampling_x;
    bVar27 = bVar27 - (char)mbd->plane[0].subsampling_y;
    local_3450 = 0.04;
    if (uVar36 != 0) {
      local_3450 = 1.0 / (double)((1 << (bVar27 + bVar26 & 0x1f)) + 0x19);
    }
    uVar29 = *(uint *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar36 != 0) * 4 + -0x28);
    puVar7 = frame_to_filter->store_buf_adr[uVar36 - 4];
    dVar60 = log(noise_levels[uVar36] + noise_levels[uVar36] + 5.0);
    if (uVar36 == 1) {
      uVar28 = 1 << (bVar26 & 0x1f);
      if (1 << (bVar26 & 0x1f) < 1) {
        uVar28 = 0;
      }
      uVar8 = 1 << (bVar27 & 0x1f);
      if (1 << (bVar27 & 0x1f) < 1) {
        uVar8 = 0;
      }
      for (uVar34 = 0; uVar34 != uVar23; uVar34 = uVar34 + 1) {
        for (uVar37 = 0; uVar37 != uVar24; uVar37 = uVar37 + 1) {
          iVar39 = ((int)uVar37 << (bVar26 & 0x1f)) + (((int)uVar34 << (bVar27 & 0x1f)) * 0x24 | 2U)
          ;
          for (uVar40 = 0; uVar32 = (ulong)uVar28, iVar43 = iVar39, uVar40 != uVar8;
              uVar40 = uVar40 + 1) {
            while (bVar47 = uVar32 != 0, uVar32 = uVar32 - 1, bVar47) {
              luma_sse_sum[uVar37 + uVar34 * 0x20] =
                   luma_sse_sum[uVar37 + uVar34 * 0x20] + frame_sse[iVar43];
              iVar43 = iVar43 + 1;
            }
            iVar39 = iVar39 + 0x24;
          }
        }
      }
    }
    lVar44 = (long)(int)(uVar20 * mb_col + uVar29 * uVar19 * mb_row) * 2 + (long)puVar7 * 2;
    lVar35 = (long)local_34c4;
    lVar46 = (long)pred * 2 + lVar35 * 2;
    iVar39 = mbd->bd;
    uVar34 = (ulong)(uVar20 * 2);
    puVar31 = frame_sse;
    lVar30 = lVar46;
    for (uVar28 = 0; uVar28 != uVar19; uVar28 = uVar28 + 1) {
      for (uVar37 = 0; uVar37 < uVar24; uVar37 = uVar37 + 8) {
        psVar1 = (short *)(lVar44 + uVar37 * 2);
        psVar2 = (short *)(lVar30 + uVar37 * 2);
        auVar52._0_2_ = *psVar1 - *psVar2;
        auVar52._2_2_ = psVar1[1] - psVar2[1];
        auVar52._4_2_ = psVar1[2] - psVar2[2];
        auVar52._6_2_ = psVar1[3] - psVar2[3];
        auVar52._8_2_ = psVar1[4] - psVar2[4];
        auVar52._10_2_ = psVar1[5] - psVar2[5];
        auVar52._12_2_ = psVar1[6] - psVar2[6];
        auVar52._14_2_ = psVar1[7] - psVar2[7];
        auVar55 = pmulhw(auVar52,auVar52);
        auVar61._8_8_ =
             (undefined8)
             (CONCAT64(CONCAT42(CONCAT22(auVar55._6_2_,auVar52._6_2_ * auVar52._6_2_),auVar55._4_2_)
                       ,CONCAT22(auVar52._4_2_ * auVar52._4_2_,auVar52._6_2_ * auVar52._6_2_)) >>
             0x10);
        auVar61._6_2_ = auVar55._2_2_;
        auVar61._4_2_ = auVar52._2_2_ * auVar52._2_2_;
        auVar61._2_2_ = auVar55._0_2_;
        auVar61._0_2_ = auVar52._0_2_ * auVar52._0_2_;
        auVar56._2_2_ = auVar55._8_2_;
        auVar56._0_2_ = auVar52._8_2_ * auVar52._8_2_;
        auVar56._4_2_ = auVar52._10_2_ * auVar52._10_2_;
        auVar56._6_2_ = auVar55._10_2_;
        auVar56._8_2_ = auVar52._12_2_ * auVar52._12_2_;
        auVar56._10_2_ = auVar55._12_2_;
        auVar56._12_2_ = auVar52._14_2_ * auVar52._14_2_;
        auVar56._14_2_ = auVar55._14_2_;
        *(undefined1 (*) [16])(puVar31 + uVar37 + 2) = auVar61;
        *(undefined1 (*) [16])(puVar31 + uVar37 + 6) = auVar56;
      }
      puVar31 = puVar31 + 0x24;
      lVar30 = lVar30 + uVar34;
      lVar44 = lVar44 + (ulong)uVar29 * 2;
    }
    uVar37 = (ulong)(uVar19 - 3);
    if ((int)(uVar19 - 3) < 1) {
      uVar37 = 0;
    }
    uVar29 = uVar20 - 4;
    uVar48 = (ulong)uVar29;
    puVar33 = acc_5x5_sse[bVar17];
    local_3400 = acc_5x5_sse[0] + 3;
    uVar32 = uVar23;
    uVar38 = uVar23;
    for (uVar42 = 0; uVar42 < uVar24; uVar42 = uVar42 + 4) {
      puVar41 = frame_sse + uVar42;
      for (lVar44 = 0; lVar44 != 0x60; lVar44 = lVar44 + 0x20) {
        uVar21 = puVar41[2];
        uVar9 = puVar41[3];
        uVar49 = *puVar41;
        uVar53 = puVar41[1];
        if (uVar42 == 0) {
          uVar49 = uVar21;
          uVar53 = uVar21;
        }
        uVar10 = puVar41[4];
        uVar11 = puVar41[5];
        uVar57 = puVar41[6];
        uVar59 = puVar41[7];
        *(uint32_t *)(local_3298 + lVar44) = uVar49;
        *(uint32_t *)(local_3298 + lVar44 + 4) = uVar53;
        *(uint32_t *)(local_3298 + lVar44 + 8) = uVar21;
        *(uint32_t *)(local_3298 + lVar44 + 0xc) = uVar9;
        if ((long)(int)uVar29 <= (long)uVar42) {
          uVar57 = uVar11;
          uVar59 = uVar11;
        }
        *(uint32_t *)(local_3288 + lVar44) = uVar10;
        *(uint32_t *)(local_3288 + lVar44 + 4) = uVar11;
        *(uint32_t *)(local_3288 + lVar44 + 8) = uVar57;
        *(uint32_t *)(local_3288 + lVar44 + 0xc) = uVar59;
        puVar41 = puVar41 + 0x24;
      }
      lVar44 = 0;
      puVar45 = local_3400;
      auVar55 = local_3278;
      auVar52 = local_3298;
      auVar56 = local_3288;
      auVar63 = local_3298;
      auVar61 = local_3258;
      local_33b8._0_4_ = local_3268;
      local_33b8._4_4_ = uStack_3264;
      local_33b8._8_4_ = uStack_3260;
      local_33b8._12_4_ = uStack_325c;
      uVar66 = local_3248;
      uVar68 = uStack_3244;
      uVar70 = uStack_3240;
      uVar71 = uStack_323c;
      while( true ) {
        auVar64 = auVar63;
        auVar65 = auVar56;
        auVar63 = auVar52;
        auVar52 = auVar55;
        if (uVar37 * 0x90 == lVar44) break;
        puVar3 = (undefined4 *)((long)puVar41 + lVar44);
        uVar12 = puVar3[2];
        uVar13 = puVar3[3];
        uVar67 = *puVar3;
        uVar69 = puVar3[1];
        if (uVar42 == 0) {
          uVar67 = uVar12;
          uVar69 = uVar12;
        }
        puVar3 = (undefined4 *)((long)puVar41 + lVar44 + 0x10);
        uVar14 = *puVar3;
        uVar15 = puVar3[1];
        uVar72 = puVar3[2];
        uVar73 = puVar3[3];
        if ((long)(int)uVar29 <= (long)uVar42) {
          uVar72 = uVar15;
          uVar73 = uVar15;
        }
        auVar55._8_8_ = 0;
        auVar55._0_8_ = puVar31;
        vsum2[1] = uVar48;
        vsum2[0] = uVar32;
        uVar21 = xx_mask_and_hadd((__m128i)(auVar55 << 0x40),vsum2,(int)uVar38);
        (*(uint32_t (*) [32])(puVar45 + -3))[0] = uVar21;
        vsum1[1] = (longlong)puVar31;
        vsum1[0] = 1;
        vsum2_00[1] = uVar48;
        vsum2_00[0] = extraout_RDX;
        uVar21 = xx_mask_and_hadd(vsum1,vsum2_00,(int)uVar38);
        puVar45[-2] = uVar21;
        vsum1_00[1] = (longlong)puVar31;
        vsum1_00[0] = 2;
        vsum2_01[1] = uVar48;
        vsum2_01[0] = extraout_RDX_00;
        uVar21 = xx_mask_and_hadd(vsum1_00,vsum2_01,(int)uVar38);
        puVar45[-1] = uVar21;
        vsum1_01[1] = (longlong)puVar31;
        vsum1_01[0] = 3;
        vsum2_02[1] = uVar48;
        vsum2_02[0] = extraout_RDX_01;
        uVar21 = xx_mask_and_hadd(vsum1_01,vsum2_02,(int)uVar38);
        *puVar45 = uVar21;
        puVar45 = puVar45 + 0x20;
        lVar44 = lVar44 + 0x90;
        auVar16._4_4_ = uVar69;
        auVar16._0_4_ = uVar67;
        auVar16._8_4_ = uVar12;
        auVar16._12_4_ = uVar13;
        uVar32 = extraout_RDX_02;
        auVar55 = auVar61;
        auVar56 = local_33b8;
        auVar61 = auVar16;
        local_33b8._0_4_ = uVar66;
        local_33b8._4_4_ = uVar68;
        local_33b8._8_4_ = uVar70;
        local_33b8._12_4_ = uVar71;
        uVar66 = uVar14;
        uVar68 = uVar15;
        uVar70 = uVar72;
        uVar71 = uVar73;
        local_3478 = auVar65;
        local_3428 = auVar64;
      }
      local_3258 = auVar61;
      local_3248 = uVar66;
      uStack_3244 = uVar68;
      uStack_3240 = uVar70;
      uStack_323c = uVar71;
      for (lVar44 = -0x180; auVar55 = auVar64, auVar64 = auVar63, lVar44 != 0;
          lVar44 = lVar44 + 0x80) {
        local_3478._4_4_ = local_33b8._4_4_;
        local_3478._0_4_ = local_33b8._0_4_;
        local_3478._8_4_ = local_33b8._8_4_;
        local_3478._12_4_ = local_33b8._12_4_;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = puVar31;
        vsum2_03[1] = uVar48;
        vsum2_03[0] = uVar32;
        iVar22 = xx_mask_and_hadd((__m128i)(auVar63 << 0x40),vsum2_03,(int)uVar38);
        *(int32_t *)((long)puVar33 + lVar44) = iVar22;
        vsum1_02[1] = (longlong)puVar31;
        vsum1_02[0] = 1;
        vsum2_04[1] = uVar48;
        vsum2_04[0] = extraout_RDX_03;
        iVar22 = xx_mask_and_hadd(vsum1_02,vsum2_04,(int)uVar38);
        *(int32_t *)((long)puVar33 + lVar44 + 4) = iVar22;
        vsum1_03[1] = (longlong)puVar31;
        vsum1_03[0] = 2;
        vsum2_05[1] = uVar48;
        vsum2_05[0] = extraout_RDX_04;
        iVar22 = xx_mask_and_hadd(vsum1_03,vsum2_05,(int)uVar38);
        *(int32_t *)((long)puVar33 + lVar44 + 8) = iVar22;
        vsum1_04[1] = (longlong)puVar31;
        vsum1_04[0] = 3;
        vsum2_06[1] = uVar48;
        vsum2_06[0] = extraout_RDX_05;
        iVar22 = xx_mask_and_hadd(vsum1_04,vsum2_06,(int)uVar38);
        *(int32_t *)((long)puVar33 + lVar44 + 0xc) = iVar22;
        uVar32 = extraout_RDX_06;
        auVar63 = auVar52;
        auVar65 = local_3478;
        auVar52 = auVar61;
        local_33b8._0_4_ = uVar66;
        local_33b8._4_4_ = uVar68;
        local_33b8._8_4_ = uVar70;
        local_33b8._12_4_ = uVar71;
        local_3428 = auVar55;
      }
      local_3298 = auVar64;
      local_3278 = auVar52;
      local_3288 = auVar65;
      local_3268 = local_33b8._0_4_;
      uStack_3264 = local_33b8._4_4_;
      uStack_3260 = local_33b8._8_4_;
      uStack_325c = local_33b8._12_4_;
      local_3400 = local_3400 + 4;
      puVar33 = puVar33 + 4;
    }
    for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
      subblock_mses_scaled[lVar44] = (double)subblock_mses[lVar44] * 0.008333333333333333;
      adStack_3318[lVar44] =
           d_factor[lVar44] *
           (1.0 / ((dVar60 + 0.5) * local_3410 *
                  (double)(~-(ulong)(dVar62 < 1e-05) & (ulong)dVar50 |
                          -(ulong)(dVar62 < 1e-05) & 0x3ee4f8b588e368f1)));
    }
    uVar37 = (ulong)(bVar18 >> 1);
    bVar27 = (char)iVar39 * '\x02' - 0x10;
    pauVar25 = acc_5x5_sse;
    if (tf_wgt_calc_lvl == 0) {
      local_3478._0_8_ = pauVar25;
      local_3428._0_8_ = luma_sse_sum;
      lVar44 = 0;
      for (uVar32 = 0; uVar32 != uVar23; uVar32 = uVar32 + 1) {
        lVar44 = (long)(int)lVar44;
        for (uVar38 = 0; uVar24 != uVar38; uVar38 = uVar38 + 1) {
          uVar6 = *(ushort *)(lVar46 + uVar38 * 2);
          uVar48 = (ulong)(((uint)(uVar37 <= uVar38) | (uint)(bVar17 >> 1 <= uVar32) * 2) << 3);
          dVar60 = ((double)((uint)(*(int *)(local_3428._0_8_ + uVar38 * 4) +
                                   *(int *)(local_3478._0_8_ + uVar38 * 4)) >> (bVar27 & 0x1f)) *
                    local_3450 * 0.041666666666666664 +
                   *(double *)((long)subblock_mses_scaled + uVar48)) *
                   *(double *)((long)adStack_3318 + uVar48);
          uVar48 = -(ulong)(dVar60 < 7.0);
          dVar60 = exp((double)(~uVar48 & 0xc01c000000000000 | (ulong)-dVar60 & uVar48));
          count[lVar35 + lVar44 + uVar38] =
               count[lVar35 + lVar44 + uVar38] + (short)(int)(dVar60 * 1000.0);
          accum[lVar35 + lVar44 + uVar38] =
               accum[lVar35 + lVar44 + uVar38] + (uint)uVar6 * (int)(dVar60 * 1000.0);
        }
        lVar44 = lVar44 + uVar38;
        local_3428._0_8_ = local_3428._0_8_ + 0x80;
        local_3478._0_8_ = local_3478._0_8_ + 0x80;
        lVar46 = lVar46 + uVar34;
      }
    }
    else {
      puVar31 = luma_sse_sum;
      lVar44 = 0;
      for (uVar32 = 0; uVar32 != uVar23; uVar32 = uVar32 + 1) {
        lVar44 = (long)(int)lVar44;
        for (uVar38 = 0; uVar24 != uVar38; uVar38 = uVar38 + 1) {
          uVar6 = *(ushort *)(lVar46 + uVar38 * 2);
          uVar48 = (ulong)(((uint)(uVar37 <= uVar38) | (uint)(bVar17 >> 1 <= uVar32) * 2) << 3);
          dVar60 = ((double)(puVar31[uVar38] + (*pauVar25)[uVar38] >> (bVar27 & 0x1f)) * local_3450
                    * 0.041666666666666664 + *(double *)((long)subblock_mses_scaled + uVar48)) *
                   *(double *)((long)adStack_3318 + uVar48);
          if (7.0 <= dVar60) {
            dVar60 = 7.0;
          }
          iVar39 = (int)((float)((int)((float)dVar60 * -12102203.0) + 0x3f7f127f) * 1000.0 + 0.5);
          count[lVar35 + lVar44 + uVar38] = count[lVar35 + lVar44 + uVar38] + (short)iVar39;
          accum[lVar35 + lVar44 + uVar38] = accum[lVar35 + lVar44 + uVar38] + (uint)uVar6 * iVar39;
        }
        puVar31 = puVar31 + 0x20;
        pauVar25 = pauVar25 + 1;
        lVar46 = lVar46 + uVar34;
        lVar44 = lVar44 + uVar38;
      }
    }
    local_34c4 = uVar20 * uVar19 + local_34c4;
  }
  return;
}

Assistant:

void av1_highbd_apply_temporal_filter_sse2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with sse2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with sse2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint32_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };
  uint16_t *pred1 = CONVERT_TO_SHORTPTR(pred);

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint16_t *ref =
        CONVERT_TO_SHORTPTR(frame_to_filter->buffers[plane]) + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[0].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[0].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx + 2];
            }
          }
        }
      }
    }

    highbd_apply_temporal_filter(
        ref, frame_stride, pred1 + plane_offset, plane_w, plane_w, plane_h,
        subblock_mses, accum + plane_offset, count + plane_offset, frame_sse,
        luma_sse_sum, mbd->bd, inv_num_ref_pixels, decay_factor, inv_factor,
        weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}